

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpainter.cpp
# Opt level: O2

void qt_format_text(QFont *fnt,QRectF *_r,int tf,QTextOption *option,QString *str,QRectF *brect,
                   int tabstops,int *ta,int tabarraylen,QPainter *painter)

{
  __uniq_ptr_impl<QPainterState,_std::default_delete<QPainterState>_> _Var1;
  bool bVar2;
  qsizetype qVar3;
  QTextLayout this;
  qsizetype qVar4;
  undefined1 *puVar5;
  char cVar6;
  char16_t cVar7;
  QFlagsStorage<Qt::AlignmentFlag> QVar8;
  int iVar9;
  QFixed QVar10;
  int iVar11;
  ulong uVar12;
  QChar *pQVar13;
  QChar *pQVar14;
  pointer pQVar15;
  byte bVar16;
  uint uVar17;
  uint uVar18;
  int iVar19;
  long lVar20;
  int i;
  LayoutDirection direction;
  ulong uVar21;
  ulong uVar22;
  long lVar23;
  int i_1;
  long in_FS_OFFSET;
  qreal qVar24;
  double dVar25;
  qreal qVar26;
  QTextLine QVar27;
  QFlagsStorage<Qt::AlignmentFlag> local_2b48;
  int local_2b3c;
  double local_2b38;
  double local_2b28;
  ulong local_2b18;
  qreal local_2b10;
  byte local_2ae4;
  QPointF local_2aa8;
  QArrayDataPointer<QTextOption::Tab> local_2a98;
  qreal qStack_2a80;
  undefined1 *local_2a78;
  QTextEngine *pQStack_2a70;
  QTextLayout local_2a60;
  QArrayDataPointer<char16_t> local_2a58;
  QArrayDataPointer<QTextLayout::FormatRange> local_2a38;
  QArrayDataPointer<char16_t> local_2a18;
  QFontMetricsF fm;
  QRectF local_29f8;
  undefined1 local_29d8 [16];
  undefined1 *local_29c8;
  QTextOption local_2960 [2];
  byte local_2930;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((((uint)tf >> 9 & 1) == 0) && (_r->h <= 0.0 || _r->w <= 0.0)) {
    if (brect == (QRectF *)0x0) goto LAB_0038c48a;
    tf = tf | 0x4000;
  }
  if (option != (QTextOption *)0x0) {
    uVar18 = *(uint *)option & 0x1ff | tf;
    uVar17 = uVar18 | 0x1000;
    if ((*(uint *)option & 0x1e00) == 0) {
      uVar17 = uVar18;
    }
    uVar17 = option->f >> 4 & 0x8000000 | uVar17;
    if (0.0 <= option->tab) {
      tf = uVar17 | 0x400;
    }
    else {
      QTextOption::tabArray((QList<double> *)local_29d8,option);
      puVar5 = local_29c8;
      QArrayDataPointer<double>::~QArrayDataPointer((QArrayDataPointer<double> *)local_29d8);
      tf = uVar17 | 0x400;
      if (puVar5 == (undefined1 *)0x0) {
        tf = uVar17;
      }
    }
  }
  local_29f8.xp = _r->xp;
  local_29f8.yp = _r->yp;
  local_29f8.w = _r->w;
  local_29f8.h = _r->h;
  direction = LeftToRight;
  if ((((uint)tf >> 0x11 & 1) == 0) && (direction = RightToLeft, ((uint)tf >> 0x12 & 1) == 0)) {
    if (option == (QTextOption *)0x0) {
      direction = LeftToRight;
      if (painter != (QPainter *)0x0) {
        _Var1._M_t.super__Tuple_impl<0UL,_QPainterState_*,_std::default_delete<QPainterState>_>.
        super__Head_base<0UL,_QPainterState_*,_false>._M_head_impl =
             *(tuple<QPainterState_*,_std::default_delete<QPainterState>_> *)
              &(((painter->d_ptr)._M_t.
                 super___uniq_ptr_impl<QPainterPrivate,_std::default_delete<QPainterPrivate>_>._M_t.
                 super__Tuple_impl<0UL,_QPainterPrivate_*,_std::default_delete<QPainterPrivate>_>.
                 super__Head_base<0UL,_QPainterPrivate_*,_false>._M_head_impl)->state)._M_t;
        if ((__uniq_ptr_impl<QPainterState,_std::default_delete<QPainterState>_>)
            _Var1._M_t.super__Tuple_impl<0UL,_QPainterState_*,_std::default_delete<QPainterState>_>.
            super__Head_base<0UL,_QPainterState_*,_false>._M_head_impl ==
            (__uniq_ptr_impl<QPainterState,_std::default_delete<QPainterState>_>)0x0) {
          direction = LayoutDirectionAuto;
        }
        else {
          direction = *(LayoutDirection *)
                       ((long)_Var1._M_t.
                              super__Tuple_impl<0UL,_QPainterState_*,_std::default_delete<QPainterState>_>
                              .super__Head_base<0UL,_QPainterState_*,_false>._M_head_impl + 0x1b0);
        }
      }
    }
    else {
      direction = *(uint *)option >> 0xe & (LayoutDirectionAuto|RightToLeft);
    }
  }
  QVar8.i = (Int)QGuiApplicationPrivate::visualAlignment(direction,(Alignment)tf);
  if ((QVar8.i >> 10 & 1) == 0) {
    bVar16 = 0;
  }
  else if ((direction == RightToLeft) || (bVar16 = 1, (QVar8.i & 1) == 0)) {
    bVar16 = (byte)((QVar8.i & 2) >> 1) & direction == RightToLeft;
  }
  local_2b48.i = QVar8.i | 0x4000;
  if (painter != (QPainter *)0x0) {
    local_2b48.i = QVar8.i;
  }
  fm.d.d.ptr = (QExplicitlySharedDataPointer<QFontPrivate>)&DAT_aaaaaaaaaaaaaaaa;
  QFontMetricsF::QFontMetricsF(&fm,fnt);
  local_2a18.d = (str->d).d;
  local_2a18.ptr = (str->d).ptr;
  local_2a18.size = (str->d).size;
  if (local_2a18.d != (Data *)0x0) {
    LOCK();
    ((local_2a18.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_2a18.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_2b3c = tabstops;
  iVar9 = 0;
  uVar12 = 0;
  if (0 < tabarraylen) {
    uVar12 = (ulong)(uint)tabarraylen;
  }
  local_2b18 = 0;
  do {
    lVar20 = (long)(int)local_2b18;
    for (uVar21 = 0; qVar4 = local_2a18.size, (long)(lVar20 + uVar21) < local_2a18.size;
        uVar21 = uVar21 + 1) {
      cVar7 = local_2a18.ptr[lVar20 + uVar21];
      if ((cVar7 == L'\r') ||
         (local_2ae4 = (byte)((uint)tf >> 8), (cVar7 == L'\n' & local_2ae4) != 0)) {
LAB_0038bc93:
        pQVar13 = QString::data((QString *)&local_2a18);
        pQVar13[lVar20 + uVar21].ucs = L' ';
      }
      else if (cVar7 == L'\t') {
        if (bVar16 == 0) goto LAB_0038bc93;
        if (tabarraylen == 0 && local_2b3c == 0) {
          qVar24 = QFontMetricsF::horizontalAdvance(&fm,(QChar)0x78);
          local_2b3c = (int)((double)((ulong)(qVar24 * 8.0) & 0x8000000000000000 |
                                     0x3fe0000000000000) + qVar24 * 8.0);
        }
      }
      else if (cVar7 == L'\n') {
        pQVar13 = QString::data((QString *)&local_2a18);
        pQVar13[lVar20 + uVar21].ucs = L'\x2028';
      }
      else if (cVar7 == L'&') {
        iVar9 = iVar9 + 1;
      }
      else if (cVar7 == L'\x9c') break;
    }
    local_2a38.size = 0;
    local_2a38.d = (Data *)0x0;
    local_2a38.ptr = (FormatRange *)0x0;
    if ((tf & 0x8000U) == 0) {
      if (((byte)((uint)tf >> 0xb) & iVar9 != 0) != 0) {
LAB_0038bd04:
        pQVar14 = QString::data((QString *)&local_2a18);
        lVar23 = 0;
        uVar22 = uVar21 & 0xffffffff;
        pQVar13 = pQVar14 + lVar20;
        while (iVar19 = (int)uVar22, iVar19 != 0) {
          cVar7 = pQVar13->ucs;
          if (cVar7 == L'&') {
            iVar19 = iVar19 + -1;
            if (iVar19 == 0) break;
            pQVar13 = pQVar13 + 1;
            cVar7 = pQVar13->ucs;
            if (((local_2b48.i & 0x4000) == 0 && (tf & 0x8000U) == 0) && (cVar7 != L'&')) {
              local_29c8 = &DAT_aaaaaaaaaaaaaaaa;
              local_29d8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
              local_29d8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
              QTextCharFormat::QTextCharFormat((QTextCharFormat *)(local_29d8 + 8));
              local_29d8._4_4_ = 1;
              local_29d8._0_4_ = (int)lVar23;
              QTextCharFormat::setFontUnderline((QTextCharFormat *)(local_29d8 + 8),true);
              QList<QTextLayout::FormatRange>::emplaceBack<QTextLayout::FormatRange_const&>
                        ((QList<QTextLayout::FormatRange> *)&local_2a38,(FormatRange *)local_29d8);
              QTextFormat::~QTextFormat((QTextFormat *)(local_29d8 + 8));
              cVar7 = pQVar13->ucs;
            }
          }
          (pQVar14 + lVar20)[lVar23].ucs = cVar7;
          pQVar13 = pQVar13 + 1;
          lVar23 = lVar23 + 1;
          uVar22 = (ulong)(iVar19 - 1);
        }
      }
    }
    else if (iVar9 != 0) goto LAB_0038bd04;
    local_2a58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_2a58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_2a58.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QString::mid((longlong)&local_2a58,(longlong)&local_2a18);
    QStackTextEngine::QStackTextEngine((QStackTextEngine *)local_29d8,(QString *)&local_2a58,fnt);
    if (option != (QTextOption *)0x0) {
      QTextOption::operator=(local_2960,option);
    }
    if ((local_2960[0].tab < 0.0) && (0 < local_2b3c)) {
      local_2960[0].tab = (qreal)local_2b3c;
    }
    QTextOption::tabs((QList<QTextOption::Tab> *)&local_2a98,local_2960);
    qVar3 = local_2a98.size;
    QArrayDataPointer<QTextOption::Tab>::~QArrayDataPointer(&local_2a98);
    if ((ta != (int *)0x0) && ((qreal)qVar3 == 0.0)) {
      local_2a98.d = (Data *)0x0;
      local_2a98.ptr = (Tab *)0x0;
      local_2a98.size = 0;
      QList<double>::reserve((QList<double> *)&local_2a98,(long)tabarraylen);
      for (uVar22 = 0; uVar12 != uVar22; uVar22 = uVar22 + 1) {
        QList<double>::append((QList<double> *)&local_2a98,(double)ta[uVar22]);
      }
      QTextOption::setTabArray(local_2960,(QList<double> *)&local_2a98);
      QArrayDataPointer<double>::~QArrayDataPointer((QArrayDataPointer<double> *)&local_2a98);
    }
    uVar17 = 8;
    if ((local_2b48.i & 8) == 0) {
      uVar17 = 1;
    }
    uVar17 = uVar17 | (direction & (LayoutDirectionAuto|RightToLeft)) << 0xe;
    uVar18 = uVar17 | local_2960[0]._0_4_ & 0xffff3e00;
    local_2960[0]._0_4_ = uVar17 | local_2960[0]._0_4_ & 0xffff2000 | 0x600;
    if ((local_2b48.i >> 0xd & 1) == 0) {
      local_2960[0]._0_4_ = uVar18;
    }
    if (option != (QTextOption *)0x0) {
      local_2960[0]._0_4_ = uVar18;
    }
    if ((local_2b48.i & 0x10000) != 0) {
      local_2930 = local_2930 | 8;
    }
    local_2a60.d = (QTextEngine *)local_29d8;
    QTextLayout::setCacheEnabled(&local_2a60,true);
    QTextLayout::setFormats(&local_2a60,(QList<QTextLayout::FormatRange> *)&local_2a38);
    if ((undefined1 *)local_2a58.size == (undefined1 *)0x0) {
      local_2b38 = QFontMetricsF::height(&fm);
      local_2b48.i = local_2b48.i | 0x4000;
      local_2a98.size = 0;
    }
    else {
      local_2b10 = 16777216.0;
      if (((local_2b48.i & 0x10000) != 0 || (tf & 0x3000U) != 0) &&
         (local_2b10 = local_29f8.w, local_29f8.w <= 0.0)) {
        local_2b10 = 0.0;
      }
      QTextLayout::beginLayout(&local_2a60);
      qVar24 = QFontMetricsF::leading(&fm);
      local_2b38 = -qVar24;
      local_2b28 = 0.0;
      do {
        local_2a98.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_2a98.ptr = (Tab *)&DAT_aaaaaaaaaaaaaaaa;
        QVar27 = QTextLayout::createLine(&local_2a60);
        local_2a98.ptr = (Tab *)QVar27.eng;
        local_2a98.d = (Data *)CONCAT44(local_2a98.d._4_4_,QVar27.index);
        if ((QTextEngine *)local_2a98.ptr == (QTextEngine *)0x0) break;
        QTextLine::setLineWidth((QTextLine *)&local_2a98,local_2b10);
        dVar25 = ceil(local_2b38 + qVar24);
        local_2a78 = (undefined1 *)0x0;
        pQStack_2a70 = (QTextEngine *)(double)(int)dVar25;
        QTextLine::setPosition((QTextLine *)&local_2a98,(QPointF *)&local_2a78);
        lVar23 = (long)(int)local_2a98.d;
        pQVar15 = QList<QScriptLine>::data(&(local_2a60.d)->lines);
        QVar10 = QScriptLine::height(pQVar15 + lVar23);
        local_2b38 = (double)QVar10.val * 0.015625 + (double)(int)dVar25;
        qVar26 = QTextLine::naturalTextWidth((QTextLine *)&local_2a98);
        if (qVar26 <= local_2b28) {
          qVar26 = local_2b28;
        }
        local_2b28 = qVar26;
      } while ((byte)(local_2b38 < local_29f8.h | brect != (QRectF *)0x0 | (byte)((uint)tf >> 9) & 1
                     ) == 1);
      QTextLayout::endLayout(&local_2a60);
      local_2a98.size = (qsizetype)local_2b28;
    }
    if ((local_2b48.i & 0x40) == 0) {
      local_2b28 = 0.0;
      if ((char)local_2b48.i < '\0') {
        local_2b28 = (local_29f8.h - local_2b38) * 0.5;
      }
    }
    else {
      local_2b28 = local_29f8.h - local_2b38;
    }
    if ((local_2b48.i & 2) == 0) {
      dVar25 = 0.0;
      if ((local_2b48.i & 4) != 0) {
        dVar25 = (local_29f8.w - (double)local_2a98.size) * 0.5;
      }
    }
    else {
      dVar25 = local_29f8.w - (double)local_2a98.size;
    }
    local_2a98.d = (Data *)(dVar25 + local_29f8.xp);
    local_2a98.ptr = (Tab *)(local_2b28 + local_29f8.yp);
    qStack_2a80 = local_2b38;
    if ((((long)(lVar20 + uVar21) < qVar4) && ((local_2b48.i & 0x80000) == 0)) &&
       (cVar6 = QRectF::contains((QRectF *)&local_29f8), cVar6 == '\0')) {
      local_2b18 = (ulong)((int)local_2b18 + (int)uVar21 + 1);
      bVar2 = true;
    }
    else {
      if (brect != (QRectF *)0x0) {
        brect->w = (qreal)local_2a98.size;
        brect->h = qStack_2a80;
        brect->xp = (qreal)local_2a98.d;
        brect->yp = (qreal)local_2a98.ptr;
      }
      local_2b18 = (local_2b18 & 0xffffffff) + uVar21;
      if ((local_2b48.i >> 0xe & 1) == 0) {
        bVar2 = false;
        iVar19 = 0;
        if (((uint)tf >> 9 & 1) == 0) {
          cVar6 = QRectF::contains((QRectF *)&local_29f8);
          if (cVar6 == '\0') {
            QPainter::save(painter);
            QPainter::setClipRect(painter,&local_29f8,IntersectClip);
            bVar2 = true;
            iVar19 = 0;
          }
          else {
            bVar2 = false;
          }
        }
        while( true ) {
          iVar11 = QTextLayout::lineCount(&local_2a60);
          if (iVar11 <= iVar19) break;
          local_2a78 = &DAT_aaaaaaaaaaaaaaaa;
          pQStack_2a70 = (QTextEngine *)&DAT_aaaaaaaaaaaaaaaa;
          QVar27 = QTextLayout::lineAt(&local_2a60,iVar19);
          this.d = local_2a60.d;
          pQStack_2a70 = QVar27.eng;
          local_2a78 = (undefined1 *)CONCAT44(local_2a78._4_4_,QVar27.index);
          (local_2a60.d)->field_0xa8 = (local_2a60.d)->field_0xa8 | 0x20;
          qVar24 = QTextLine::horizontalAdvance((QTextLine *)&local_2a78);
          if ((local_2b48.i & 2) == 0) {
            local_2aa8.xp = 0.0;
            if ((local_2b48.i & 4) != 0) {
              local_2aa8.xp = (local_29f8.w - qVar24) * 0.5;
            }
          }
          else {
            dVar25 = local_29f8.w - qVar24;
            lVar20 = (long)(int)local_2a78;
            pQVar15 = QList<QScriptLine>::data(&(this.d)->lines);
            QVar10 = QTextEngine::leadingSpaceWidth(this.d,pQVar15 + lVar20);
            local_2aa8.xp = (double)QVar10.val * -0.015625 + dVar25;
          }
          local_2aa8.xp = local_2aa8.xp + local_29f8.xp;
          local_2aa8.yp = local_2b28 + local_29f8.yp;
          QTextLine::draw((QTextLine *)&local_2a78,painter,&local_2aa8);
          QTextEngine::drawDecorations(this.d,painter);
          iVar19 = iVar19 + 1;
        }
        if (bVar2) {
          QPainter::restore(painter);
        }
        bVar2 = false;
      }
      else {
        bVar2 = false;
      }
    }
    QTextLayout::~QTextLayout(&local_2a60);
    QStackTextEngine::~QStackTextEngine((QStackTextEngine *)local_29d8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_2a58);
    QArrayDataPointer<QTextLayout::FormatRange>::~QArrayDataPointer(&local_2a38);
  } while (bVar2);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_2a18);
  QFontMetricsF::~QFontMetricsF(&fm);
LAB_0038c48a:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void qt_format_text(const QFont &fnt, const QRectF &_r,
                    int tf, const QTextOption *option, const QString& str, QRectF *brect,
                    int tabstops, int *ta, int tabarraylen,
                    QPainter *painter)
{

    Q_ASSERT( !((tf & ~Qt::TextDontPrint)!=0 && option!=nullptr) ); // we either have an option or flags

    if (_r.isEmpty() && !(tf & Qt::TextDontClip)) {
        if (!brect)
            return;
        else
            tf |= Qt::TextDontPrint;
    }

    if (option) {
        tf |= option->alignment();
        if (option->wrapMode() != QTextOption::NoWrap)
            tf |= Qt::TextWordWrap;

        if (option->flags() & QTextOption::IncludeTrailingSpaces)
            tf |= Qt::TextIncludeTrailingSpaces;

        if (option->tabStopDistance() >= 0 || !option->tabArray().isEmpty())
            tf |= Qt::TextExpandTabs;
    }

    // we need to copy r here to protect against the case (&r == brect).
    QRectF r(_r);

    bool dontclip  = (tf & Qt::TextDontClip);
    bool wordwrap  = (tf & Qt::TextWordWrap) || (tf & Qt::TextWrapAnywhere);
    bool singleline = (tf & Qt::TextSingleLine);
    bool showmnemonic = (tf & Qt::TextShowMnemonic);
    bool hidemnmemonic = (tf & Qt::TextHideMnemonic);

    Qt::LayoutDirection layout_direction;
    if (tf & Qt::TextForceLeftToRight)
        layout_direction = Qt::LeftToRight;
    else if (tf & Qt::TextForceRightToLeft)
        layout_direction = Qt::RightToLeft;
    else if (option)
        layout_direction = option->textDirection();
    else if (painter)
        layout_direction = painter->layoutDirection();
    else
        layout_direction = Qt::LeftToRight;

    tf = QGuiApplicationPrivate::visualAlignment(layout_direction, QFlag(tf));

    bool isRightToLeft = layout_direction == Qt::RightToLeft;
    bool expandtabs = ((tf & Qt::TextExpandTabs) &&
                        (((tf & Qt::AlignLeft) && !isRightToLeft) ||
                          ((tf & Qt::AlignRight) && isRightToLeft)));

    if (!painter)
        tf |= Qt::TextDontPrint;

    uint maxUnderlines = 0;

    QFontMetricsF fm(fnt);
    QString text = str;
    int offset = 0;
start_lengthVariant:
    bool hasMoreLengthVariants = false;
    // compatible behaviour to the old implementation. Replace
    // tabs by spaces
    int old_offset = offset;
    for (; offset < text.size(); offset++) {
        QChar chr = text.at(offset);
        if (chr == u'\r' || (singleline && chr == u'\n')) {
            text[offset] = u' ';
        } else if (chr == u'\n') {
            text[offset] = QChar::LineSeparator;
        } else if (chr == u'&') {
            ++maxUnderlines;
        } else if (chr == u'\t') {
            if (!expandtabs) {
                text[offset] = u' ';
            } else if (!tabarraylen && !tabstops) {
                tabstops = qRound(fm.horizontalAdvance(u'x')*8);
            }
        } else if (chr == u'\x9c') {
            // string with multiple length variants
            hasMoreLengthVariants = true;
            break;
        }
    }

    QList<QTextLayout::FormatRange> underlineFormats;
    int length = offset - old_offset;
    if ((hidemnmemonic || showmnemonic) && maxUnderlines > 0) {
        QChar *cout = text.data() + old_offset;
        QChar *cout0 = cout;
        QChar *cin = cout;
        int l = length;
        while (l) {
            if (*cin == u'&') {
                ++cin;
                --length;
                --l;
                if (!l)
                    break;
                if (*cin != u'&' && !hidemnmemonic && !(tf & Qt::TextDontPrint)) {
                    QTextLayout::FormatRange range;
                    range.start = cout - cout0;
                    range.length = 1;
                    range.format.setFontUnderline(true);
                    underlineFormats.append(range);
                }
#ifdef Q_OS_MAC
            } else if (hidemnmemonic && *cin == u'(' && l >= 4 &&
                       cin[1] == u'&' && cin[2] != u'&' &&
                       cin[3] == u')') {
                int n = 0;
                while ((cout - n) > cout0 && (cout - n - 1)->isSpace())
                    ++n;
                cout -= n;
                cin += 4;
                length -= n + 4;
                l -= 4;
                continue;
#endif //Q_OS_MAC
            }
            *cout = *cin;
            ++cout;
            ++cin;
            --l;
        }
    }

    qreal height = 0;
    qreal width = 0;

    QString finalText = text.mid(old_offset, length);
    Q_DECL_UNINITIALIZED QStackTextEngine engine(finalText, fnt);
    if (option) {
        engine.option = *option;
    }

    if (engine.option.tabStopDistance() < 0 && tabstops > 0)
        engine.option.setTabStopDistance(tabstops);

    if (engine.option.tabs().isEmpty() && ta) {
        QList<qreal> tabs;
        tabs.reserve(tabarraylen);
        for (int i = 0; i < tabarraylen; i++)
            tabs.append(qreal(ta[i]));
        engine.option.setTabArray(tabs);
    }

    engine.option.setTextDirection(layout_direction);
    if (tf & Qt::AlignJustify)
        engine.option.setAlignment(Qt::AlignJustify);
    else
        engine.option.setAlignment(Qt::AlignLeft); // do not do alignment twice

    if (!option && (tf & Qt::TextWrapAnywhere))
        engine.option.setWrapMode(QTextOption::WrapAnywhere);

    if (tf & Qt::TextJustificationForced)
        engine.forceJustification = true;
    QTextLayout textLayout(&engine);
    textLayout.setCacheEnabled(true);
    textLayout.setFormats(underlineFormats);

    if (finalText.isEmpty()) {
        height = fm.height();
        width = 0;
        tf |= Qt::TextDontPrint;
    } else {
        qreal lineWidth = 0x01000000;
        if (wordwrap || (tf & Qt::TextJustificationForced))
            lineWidth = qMax<qreal>(0, r.width());
        if (!wordwrap)
            tf |= Qt::TextIncludeTrailingSpaces;
        textLayout.beginLayout();

        qreal leading = fm.leading();
        height = -leading;

        while (1) {
            QTextLine l = textLayout.createLine();
            if (!l.isValid())
                break;

            l.setLineWidth(lineWidth);
            height += leading;

            // Make sure lines are positioned on whole pixels
            height = qCeil(height);
            l.setPosition(QPointF(0., height));
            height += textLayout.engine()->lines[l.lineNumber()].height().toReal();
            width = qMax(width, l.naturalTextWidth());
            if (!dontclip && !brect && height >= r.height())
                break;
        }
        textLayout.endLayout();
    }

    qreal yoff = 0;
    qreal xoff = 0;
    if (tf & Qt::AlignBottom)
        yoff = r.height() - height;
    else if (tf & Qt::AlignVCenter)
        yoff = (r.height() - height)/2;

    if (tf & Qt::AlignRight)
        xoff = r.width() - width;
    else if (tf & Qt::AlignHCenter)
        xoff = (r.width() - width)/2;

    QRectF bounds = QRectF(r.x() + xoff, r.y() + yoff, width, height);

    if (hasMoreLengthVariants && !(tf & Qt::TextLongestVariant) && !r.contains(bounds)) {
        offset++;
        goto start_lengthVariant;
    }
    if (brect)
        *brect = bounds;

    if (!(tf & Qt::TextDontPrint)) {
        bool restore = false;
        if (!dontclip && !r.contains(bounds)) {
            restore = true;
            painter->save();
            painter->setClipRect(r, Qt::IntersectClip);
        }

        for (int i = 0; i < textLayout.lineCount(); i++) {
            QTextLine line = textLayout.lineAt(i);
            QTextEngine *eng = textLayout.engine();
            eng->enableDelayDecorations();

            qreal advance = line.horizontalAdvance();
            xoff = 0;
            if (tf & Qt::AlignRight) {
                xoff = r.width() - advance -
                    eng->leadingSpaceWidth(eng->lines[line.lineNumber()]).toReal();
            }
            else if (tf & Qt::AlignHCenter)
                xoff = (r.width() - advance) / 2;

            line.draw(painter, QPointF(r.x() + xoff, r.y() + yoff));
            eng->drawDecorations(painter);
        }

        if (restore) {
            painter->restore();
        }
    }
}